

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_v_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int local_15c;
  uint16_t *local_110;
  int i;
  __m128i above1_u16;
  __m128i above0_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 4);
  uVar3 = *(undefined8 *)(above + 8);
  uVar4 = *(undefined8 *)(above + 0xc);
  local_110 = dst;
  for (local_15c = 0; local_15c < 2; local_15c = local_15c + 1) {
    *(undefined8 *)local_110 = uVar1;
    *(undefined8 *)(local_110 + 4) = uVar2;
    *(undefined8 *)(local_110 + 8) = uVar3;
    *(undefined8 *)(local_110 + 0xc) = uVar4;
    local_110 = local_110 + stride;
    *(undefined8 *)local_110 = uVar1;
    *(undefined8 *)(local_110 + 4) = uVar2;
    *(undefined8 *)(local_110 + 8) = uVar3;
    *(undefined8 *)(local_110 + 0xc) = uVar4;
    local_110 = local_110 + stride;
    *(undefined8 *)local_110 = uVar1;
    *(undefined8 *)(local_110 + 4) = uVar2;
    *(undefined8 *)(local_110 + 8) = uVar3;
    *(undefined8 *)(local_110 + 0xc) = uVar4;
    local_110 = local_110 + stride;
    *(undefined8 *)local_110 = uVar1;
    *(undefined8 *)(local_110 + 4) = uVar2;
    *(undefined8 *)(local_110 + 8) = uVar3;
    *(undefined8 *)(local_110 + 0xc) = uVar4;
    local_110 = local_110 + stride;
  }
  return;
}

Assistant:

void aom_highbd_v_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above0_u16 = _mm_load_si128((const __m128i *)above);
  const __m128i above1_u16 = _mm_load_si128((const __m128i *)(above + 8));
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
  }
}